

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<long,_int,_0>::ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (long *t,int *u,long *result)

{
  int iVar1;
  long lVar2;
  
  iVar1 = *u;
  if ((long)iVar1 == -1) {
    lVar2 = 0;
  }
  else {
    if (iVar1 == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    lVar2 = *t % (long)iVar1;
  }
  *result = lVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //trap corner case
        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)(t % u);
    }